

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O0

void printPdb(Particle *particle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  FILE *__stream;
  ostream *this;
  char *pcVar7;
  char *command;
  char *newFile;
  int k4;
  int k3;
  int k2;
  int k1;
  char *AA;
  int i;
  int lenOfAA;
  char *fileName;
  FILE *output;
  Particle *particle_local;
  
  pcVar6 = catStrIntStr(energyFileAddress,"tempFile/temp",particle->index,".pdb");
  __stream = fopen(pcVar6,"w");
  if (__stream == (FILE *)0x0) {
    this = std::operator<<((ostream *)&std::cout,"Can\'t write temp.pdb");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  iVar1 = particle->numAA;
  for (AA._0_4_ = 0; (int)AA < iVar1; AA._0_4_ = (int)AA + 1) {
    pcVar7 = getRelativeAA(particle->seq[(int)AA]);
    iVar2 = (int)AA * 0xc;
    iVar3 = (int)AA * 0xc;
    iVar4 = (int)AA * 0xc;
    iVar5 = (int)AA * 0xc;
    fprintf(__stream,"ATOM   %4d  N   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
            particle->addO_origin[iVar2],particle->addO_origin[iVar2 + 1],
            particle->addO_origin[iVar2 + 2],(ulong)((int)AA * 4 + 1),pcVar7,(ulong)((int)AA + 1));
    fprintf(__stream,"ATOM   %4d  CA  %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
            particle->addO_origin[iVar3 + 3],particle->addO_origin[iVar3 + 4],
            particle->addO_origin[iVar3 + 5],(ulong)((int)AA * 4 + 2),pcVar7,(ulong)((int)AA + 1));
    fprintf(__stream,"ATOM   %4d  C   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
            particle->addO_origin[iVar4 + 6],particle->addO_origin[iVar4 + 7],
            particle->addO_origin[iVar4 + 8],(ulong)((int)AA * 4 + 3),pcVar7,(ulong)((int)AA + 1));
    fprintf(__stream,"ATOM   %4d  O   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
            particle->addO_origin[iVar5 + 9],particle->addO_origin[iVar5 + 10],
            particle->addO_origin[iVar5 + 0xb],(ulong)((int)AA * 4 + 4),pcVar7,(ulong)((int)AA + 1))
    ;
    if (pcVar7 != (char *)0x0) {
      operator_delete(pcVar7);
    }
  }
  fclose(__stream);
  pcVar7 = catStrIntStr(energyFileAddress,"tempFile/temp_",particle->index,".pdb");
  pcVar6 = catStrStr(refine_1Address,"scrwl4/Scwrl4 -i ",pcVar6," -o ",pcVar7);
  system(pcVar6);
  return;
}

Assistant:

void printPdb(Particle * particle){
    FILE * output;
    //cout << "index= " << particle->index << endl;
    //const char *fileName = catStrIntStr("/home/ws/zzZyj/data/energyFile/tempFile/temp", particle->index, ".pdb");
    const char *fileName = catStrIntStr(energyFileAddress,"tempFile/temp", particle->index, ".pdb");
    output = fopen(fileName, "w");
    if (output == NULL) {
        cout << "Can't write temp.pdb" << endl;
        exit(-1);
    }
    int lenOfAA = particle->numAA;
    for (int i=0; i<lenOfAA; i++){
        char *AA = getRelativeAA(particle->seq[i]);
        int k1 = i*4*3, k2 = i*4*3+3, k3 = i*4*3+6, k4 = i*4*3+9;
        fprintf(output, "ATOM   %4d  N   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+1, AA, i+1, particle->addO_origin[k1], particle->addO_origin[k1+1], particle->addO_origin[k1+2]);
        fprintf(output, "ATOM   %4d  CA  %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+2, AA, i+1, particle->addO_origin[k2], particle->addO_origin[k2+1], particle->addO_origin[k2+2]);
        fprintf(output, "ATOM   %4d  C   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+3, AA, i+1, particle->addO_origin[k3], particle->addO_origin[k3+1], particle->addO_origin[k3+2]);
        fprintf(output, "ATOM   %4d  O   %3s   %3d    %8.3f%8.3f%8.3f  1.00  0.00\n",
                4*i+4, AA, i+1, particle->addO_origin[k4], particle->addO_origin[k4+1], particle->addO_origin[k4+2]);
        delete AA;
    }
    fclose(output);
    //system("/home/ws/GL/refine1/scrwl4/Scwrl4 -i /home/ws/zzZyj/data/temp.pdb -o /home/ws/zzZyj/data/temp1.pdb");
    //const char *newFile = catStrIntStr("/home/ws/zzZyj/data/energyFile/tempFile/temp_", particle->index, ".pdb");
    const char *newFile = catStrIntStr(energyFileAddress,"tempFile/temp_", particle->index, ".pdb");
    const char *command = catStrStr(refine_1Address, "scrwl4/Scwrl4 -i ", fileName,
                                    " -o ", newFile);
    system(command);
}